

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

string * __thiscall
vkt::shaderexecutor::
GenFuncCaseFactory<vkt::shaderexecutor::Signature<float,float,float,float,vkt::shaderexecutor::Void>>
::getName_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,*(long *)((long)this + 0x28),
             *(long *)((long)this + 0x30) + *(long *)((long)this + 0x28));
  return __return_storage_ptr__;
}

Assistant:

string				getName				(void) const { return m_name; }